

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O3

int libtorrent::anon_unknown_10::line_longer_than(bdecode_node *e,int limit)

{
  bdecode_token bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_80;
  
  lVar4 = (long)e->m_token_idx;
  if (lVar4 == -1) goto switchD_0018e89b_caseD_0;
  bVar1 = e->m_root_tokens[lVar4];
  switch((ulong)bVar1 >> 0x1d & 7) {
  case 0:
    break;
  case 1:
    if (limit < 4) {
      return -1;
    }
    iVar5 = bdecode_node::dict_size(e);
    if (0 < iVar5) {
      iVar5 = 4;
      iVar6 = 0;
      do {
        bdecode_node::dict_at(&local_80,e,iVar6);
        iVar2 = (int)local_80.first.len_;
        if (local_80.second.m_tokens.
            super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            .
            super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.second.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.second.m_tokens.
                                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                .
                                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.second.m_tokens.
                                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                .
                                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar5 = iVar2 + iVar5 + 4;
        if (limit < iVar5) {
          return -1;
        }
        bdecode_node::dict_at(&local_80,e,iVar6);
        iVar2 = line_longer_than(&local_80.second,limit - iVar5);
        if (local_80.second.m_tokens.
            super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            .
            super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_80.second.m_tokens.
                          super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          .
                          super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.second.m_tokens.
                                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                .
                                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.second.m_tokens.
                                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                .
                                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (iVar2 == -1) {
          return -1;
        }
        iVar5 = iVar2 + iVar5 + 1;
        iVar6 = iVar6 + 1;
        iVar2 = bdecode_node::dict_size(e);
      } while (iVar6 < iVar2);
      goto LAB_0018e8a3;
    }
    break;
  case 2:
    if (limit < 4) {
      return -1;
    }
    iVar5 = bdecode_node::list_size(e);
    if (0 < iVar5) {
      iVar6 = 0;
      iVar5 = 4;
      do {
        bdecode_node::list_at((bdecode_node *)&local_80,e,iVar6);
        iVar2 = line_longer_than((bdecode_node *)&local_80,limit - iVar5);
        if (local_80.first.ptr_ != (char *)0x0) {
          operator_delete(local_80.first.ptr_,
                          (long)local_80.second.m_tokens.
                                super_vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                .
                                super__Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                          (long)local_80.first.ptr_);
        }
        if (iVar2 == -1) {
          return -1;
        }
        iVar5 = iVar5 + iVar2 + 2;
        iVar6 = iVar6 + 1;
        iVar2 = bdecode_node::list_size(e);
      } while (iVar6 < iVar2);
      goto LAB_0018e8a3;
    }
    break;
  case 3:
    iVar5 = ((*(uint *)(e->m_root_tokens + lVar4 + 1) & 0x1fffffff) -
            ((bVar1._4_4_ >> 0x1d) + (bVar1._0_4_ & 0x1fffffff))) + 1;
    goto LAB_0018e8a3;
  case 4:
    uVar3 = bdecode_node::int_value(e);
    if ((long)uVar3 < 1) {
      iVar5 = 2;
    }
    else {
      iVar5 = 2;
      do {
        iVar5 = iVar5 + 1;
        bVar7 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar7);
    }
    goto LAB_0018e8a3;
  default:
    iVar5 = 0;
    goto LAB_0018e8a3;
  }
switchD_0018e89b_caseD_0:
  iVar5 = 4;
LAB_0018e8a3:
  iVar6 = -1;
  if (iVar5 <= limit) {
    iVar6 = iVar5;
  }
  return iVar6;
}

Assistant:

int line_longer_than(bdecode_node const& e, int limit)
	{
		int line_len = 0;
		switch (e.type())
		{
		case bdecode_node::list_t:
			line_len += 4;
			if (line_len > limit) return -1;
			for (int i = 0; i < e.list_size(); ++i)
			{
				int const ret = line_longer_than(e.list_at(i), limit - line_len);
				if (ret == -1) return -1;
				line_len += ret + 2;
			}
			break;
		case bdecode_node::dict_t:
			line_len += 4;
			if (line_len > limit) return -1;
			for (int i = 0; i < e.dict_size(); ++i)
			{
				line_len += 4 + int(e.dict_at(i).first.size());
				if (line_len > limit) return -1;
				int const ret = line_longer_than(e.dict_at(i).second, limit - line_len);
				if (ret == -1) return -1;
				line_len += ret + 1;
			}
			break;
		case bdecode_node::string_t:
			line_len += 3 + e.string_length();
			break;
		case bdecode_node::int_t:
		{
			std::int64_t val = e.int_value();
			while (val > 0)
			{
				++line_len;
				val /= 10;
			}
			line_len += 2;
		}
		break;
		case bdecode_node::none_t:
			line_len += 4;
			break;
		}

		if (line_len > limit) return -1;
		return line_len;
	}